

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tree_schema_common.c
# Opt level: O0

ly_bool lys_has_dep_mods(lys_module *mod)

{
  ulong local_40;
  ulong local_30;
  ulong local_20;
  uint64_t u;
  lys_module *mod_local;
  
  if ((mod->parsed->features == (lysp_feature *)0x0) &&
     (mod->parsed->groupings == (lysp_node_grp *)0x0)) {
    local_20 = 0;
    while( true ) {
      if (mod->parsed->includes == (lysp_include *)0x0) {
        local_30 = 0;
      }
      else {
        local_30 = *(ulong *)(mod->parsed->includes[-1].rev + 8);
      }
      if (local_30 <= local_20) {
        if (mod->parsed->augments != (lysp_node_augment *)0x0) {
          return '\x01';
        }
        local_20 = 0;
        while( true ) {
          if (mod->parsed->includes == (lysp_include *)0x0) {
            local_40 = 0;
          }
          else {
            local_40 = *(ulong *)(mod->parsed->includes[-1].rev + 8);
          }
          if (local_40 <= local_20) break;
          if ((mod->parsed->includes[local_20].submodule)->augments != (lysp_node_augment *)0x0) {
            return '\x01';
          }
          local_20 = local_20 + 1;
        }
        return '\0';
      }
      if ((mod->parsed->includes[local_20].submodule)->groupings != (lysp_node_grp *)0x0) break;
      local_20 = local_20 + 1;
    }
  }
  return '\x01';
}

Assistant:

ly_bool
lys_has_dep_mods(const struct lys_module *mod)
{
    LY_ARRAY_COUNT_TYPE u;

    /* features */
    if (mod->parsed->features) {
        return 1;
    }

    /* groupings */
    if (mod->parsed->groupings) {
        return 1;
    }
    LY_ARRAY_FOR(mod->parsed->includes, u) {
        if (mod->parsed->includes[u].submodule->groupings) {
            return 1;
        }
    }

    /* augments (adding nodes with leafrefs) */
    if (mod->parsed->augments) {
        return 1;
    }
    LY_ARRAY_FOR(mod->parsed->includes, u) {
        if (mod->parsed->includes[u].submodule->augments) {
            return 1;
        }
    }

    return 0;
}